

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O3

int minTemp2_fast_moreThen5(word *pInOut,int iVar,int iQ,int jQ,int nWords,int *pDifStart)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  
  bVar1 = (byte)(iVar + -6);
  if (nWords < 1) {
    iVar4 = 0;
    iVar2 = 0;
  }
  else {
    uVar5 = 1 << (bVar1 & 0x1f);
    uVar3 = nWords - 1;
    if ((int)uVar5 < 2) {
      uVar5 = 1;
    }
    do {
      if (iVar + -6 != 0x1f) {
        lVar6 = 0;
        do {
          iVar2 = -(uint)(pInOut[((ulong)uVar3 + lVar6) - (long)(iQ << (bVar1 & 0x1f))] <
                         pInOut[((ulong)uVar3 + lVar6) - (long)(jQ << (bVar1 & 0x1f))]);
          if (pInOut[((ulong)uVar3 + lVar6) - (long)(jQ << (bVar1 & 0x1f))] <
              pInOut[((ulong)uVar3 + lVar6) - (long)(iQ << (bVar1 & 0x1f))]) {
            iVar2 = 1;
          }
          if (iVar2 != 0) {
            iVar4 = uVar3 + 1;
            if (iVar2 == -1) goto LAB_00569d3f;
            iVar2 = 1;
            goto LAB_00569d57;
          }
          lVar6 = lVar6 + -1;
        } while (-lVar6 != (ulong)uVar5);
      }
      uVar3 = uVar3 + (-4 << (bVar1 & 0x1f));
    } while (-1 < (int)uVar3);
    iVar4 = 0;
LAB_00569d3f:
    iVar2 = 0;
  }
LAB_00569d57:
  *pDifStart = iVar4;
  return iVar2;
}

Assistant:

int minTemp2_fast_moreThen5(word* pInOut, int iVar, int iQ, int jQ, int nWords, int* pDifStart)
{
    int i, j, temp;
    int  wordBlock = 1<<(iVar-6);
    int  shiftBlock = wordBlock*4;
//    printf("in minTemp2_fast_moreThen5\n");

    for(i=nWords - 1; i>=0; i-=shiftBlock)
        for(j=0;j<wordBlock;j++)
        {
            temp = CompareWords(pInOut[i-j-iQ*wordBlock],pInOut[i-j-jQ*wordBlock]);
            if(temp == 0)
                continue;
            else if(temp == -1)
            {
                *pDifStart = i+1;
                return 0;
            }
            else
            {
                *pDifStart = i+1;
                return 1;
            }
        }
    *pDifStart=0;
//    printf("out minTemp2_fast_moreThen5\n");
    
    return 0;
}